

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_CH_archive.cpp
# Opt level: O0

void __thiscall
myEmployeeCustomConstructor::ArchiveOUTconstructor
          (myEmployeeCustomConstructor *this,ChArchiveOut *marchive)

{
  ChArchiveOut *pCVar1;
  ChNameValue<int> local_58;
  ChNameValue<double> local_30;
  ChArchiveOut *local_18;
  ChArchiveOut *marchive_local;
  myEmployeeCustomConstructor *this_local;
  
  local_18 = marchive;
  marchive_local = (ChArchiveOut *)this;
  chrono::ChArchiveOut::VersionWrite<myEmployeeCustomConstructor>(marchive);
  pCVar1 = local_18;
  chrono::make_ChNameValue<double>(&local_30,"latitude",&this->latitude,'\0');
  chrono::ChArchiveOut::operator<<(pCVar1,&local_30);
  chrono::ChNameValue<double>::~ChNameValue(&local_30);
  pCVar1 = local_18;
  chrono::make_ChNameValue<int>(&local_58,"kids",&this->kids,'\0');
  chrono::ChArchiveOut::operator<<(pCVar1,&local_58);
  chrono::ChNameValue<int>::~ChNameValue(&local_58);
  return;
}

Assistant:

virtual void ArchiveOUTconstructor(ChArchiveOut& marchive)
    {
        // suggested: use versioning
        marchive.VersionWrite<myEmployeeCustomConstructor>();

        // serialize the parameters of the constructor:
        marchive << CHNVP(latitude);
        marchive << CHNVP(kids);
    }